

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

BasicBlock * __thiscall IR::IRBuilder::newBasicBlock(IRBuilder *this)

{
  Function *pFVar1;
  Function *pFVar2;
  _Fwd_list_node_base *p_Var3;
  
  pFVar1 = this->function_;
  p_Var3 = (_Fwd_list_node_base *)operator_new(0x30);
  pFVar2 = this->function_;
  p_Var3[1]._M_next = (_Fwd_list_node_base *)0x0;
  p_Var3[2]._M_next = (_Fwd_list_node_base *)0x0;
  p_Var3[3]._M_next = (_Fwd_list_node_base *)0x0;
  p_Var3[4]._M_next = (_Fwd_list_node_base *)pFVar2;
  *(undefined4 *)&p_Var3[5]._M_next = 0xffffffff;
  p_Var3->_M_next =
       (pFVar1->blocks_).super__Fwd_list_base<IR::BasicBlock,_std::allocator<IR::BasicBlock>_>.
       _M_impl._M_head._M_next;
  (pFVar1->blocks_).super__Fwd_list_base<IR::BasicBlock,_std::allocator<IR::BasicBlock>_>._M_impl.
  _M_head._M_next = p_Var3;
  return (BasicBlock *)
         ((pFVar2->blocks_).super__Fwd_list_base<IR::BasicBlock,_std::allocator<IR::BasicBlock>_>.
          _M_impl._M_head._M_next + 1);
}

Assistant:

BasicBlock* IRBuilder::newBasicBlock() {
  function_->blocks_.emplace_front(function_);
  return &function_->blocks_.front();
}